

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

bool __thiscall GenericModel::setFlags(GenericModel *this,QModelIndex *index,ItemFlags flags)

{
  GenericModelPrivate *pGVar1;
  bool bVar2;
  QList<int> local_58;
  Int local_38;
  Int local_34;
  GenericModelItem *local_30;
  GenericModelItem *item;
  GenericModelPrivate *d;
  QModelIndex *index_local;
  GenericModel *this_local;
  ItemFlags flags_local;
  
  d = (GenericModelPrivate *)index;
  index_local = (QModelIndex *)this;
  this_local._0_4_ = flags.i;
  bVar2 = QModelIndex::isValid(index);
  if (bVar2) {
    item = (GenericModelItem *)d_func(this);
    local_30 = GenericModelPrivate::itemForIndex((GenericModelPrivate *)item,(QModelIndex *)d);
    local_34 = (local_30->flags).i;
    local_38 = this_local._0_4_;
    bVar2 = ::operator!=((QFlags<Qt::ItemFlag>)local_34,(QFlags<Qt::ItemFlag>)this_local._0_4_);
    pGVar1 = d;
    if (bVar2) {
      (local_30->flags).i = this_local._0_4_;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (int *)0x0;
      local_58.d.size = 0;
      QList<int>::QList(&local_58);
      QAbstractItemModel::dataChanged
                ((QModelIndex *)this,(QModelIndex *)pGVar1,(QList_conflict2 *)pGVar1);
      QList<int>::~QList(&local_58);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GenericModel::setFlags(const QModelIndex &index, Qt::ItemFlags flags)
{
    if (!index.isValid())
        return false;
    Q_ASSERT(index.model() == this);
    Q_D(GenericModel);
    GenericModelItem *const item = d->itemForIndex(index);
    if (item->flags != flags) {
        item->flags = flags;
        dataChanged(index, index);
    }
    return true;
}